

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::DoTraceExecutionMode(FunctionBody *this,char *eventDescription)

{
  Type *this_00;
  uint sourceContextId;
  code *pcVar1;
  bool bVar2;
  ExecutionMode executionMode;
  int iVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  FunctionInfo *pFVar6;
  undefined4 extraout_var;
  char *pcVar7;
  wchar local_98 [4];
  char16 functionIdString [42];
  
  pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  sourceContextId =
       ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->m_srcInfo
          ).ptr)->sourceContextInfo).ptr)->sourceContextId;
  if (pFVar6 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_0076fc79;
    *puVar5 = 0;
    pFVar6 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015b6718,ExecutionModePhase,sourceContextId,
                            pFVar6->functionId);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1bcf,
                                "(Js::Configuration::Global.flags.Trace.IsEnabled(((Phase::ExecutionModePhase)), ((this)->GetSourceContextId()), ((this)->GetLocalFunctionId())))"
                                ,"PHASE_TRACE(Phase::ExecutionModePhase, this)");
    if (!bVar2) {
LAB_0076fc79:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  this_00 = &this->executionState;
  FunctionExecutionStateMachine::AssertIsInitialized(this_00);
  iVar3 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
  FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_98);
  executionMode = FunctionExecutionStateMachine::GetExecutionMode(this_00);
  pcVar7 = ExecutionModeName(executionMode);
  uVar4 = GetCountField(this,ByteCodeCount);
  Output::Print(L"ExecutionMode - function: %s (%s), mode: %S, size: %u, ",
                CONCAT44(extraout_var,iVar3),(wchar (*) [42])local_98,pcVar7,(ulong)uVar4);
  FunctionExecutionStateMachine::PrintLimits(this_00);
  if (eventDescription != (char *)0x0) {
    Output::Print(L", event: %S");
  }
  Output::Print(L"\n");
  Output::Flush();
  return;
}

Assistant:

void FunctionBody::DoTraceExecutionMode(const char *const eventDescription) const
    {
        Assert(PHASE_TRACE(Phase::ExecutionModePhase, this));
        executionState.AssertIsInitialized();

        char16 functionIdString[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(
            _u("ExecutionMode - ")
                _u("function: %s (%s), ")
                _u("mode: %S, ")
                _u("size: %u, "),
            GetDisplayName(),
                GetDebugNumberSet(functionIdString),
            ExecutionModeName(executionState.GetExecutionMode()),
            GetByteCodeCount());

        executionState.PrintLimits();

        if(eventDescription)
        {
            Output::Print(_u(", event: %S"), eventDescription);
        }

        Output::Print(_u("\n"));
        Output::Flush();
    }